

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_>::read_next
          (basic_json_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          error_code *ec)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  basic_json_parser<char,_std::allocator<char>_> *this_00;
  pointer pcVar5;
  undefined1 uVar6;
  undefined7 in_register_00000009;
  sockaddr *__addr;
  int __fd;
  error_code *in_RSI;
  long in_RDI;
  span<const_char,_18446744073709551615UL> s_1;
  bool eof;
  span<const_char,_18446744073709551615UL> s;
  basic_json_visitor<char> *in_stack_ffffffffffffff98;
  basic_json_parser<char,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  basic_json_parser<char,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  span<const_char,_18446744073709551615UL> in_stack_ffffffffffffffc8;
  span<const_char,_18446744073709551615UL> local_20;
  error_code *local_10;
  
  local_10 = in_RSI;
  bVar1 = json_source_adaptor<jsoncons::string_source<char>_>::is_error
                    ((json_source_adaptor<jsoncons::string_source<char>_> *)0x4e5f6d);
  if (bVar1) {
    std::error_code::operator=
              ((error_code *)in_stack_ffffffffffffffb0,
               (json_errc)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    return;
  }
  basic_json_parser<char,_std::allocator<char>_>::reset(in_stack_ffffffffffffffa0);
  while (bVar1 = basic_json_parser<char,_std::allocator<char>_>::stopped
                           ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x30)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = basic_json_parser<char,_std::allocator<char>_>::source_exhausted
                      ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x30));
    if (bVar1) {
      local_20 = json_source_adaptor<jsoncons::string_source<char>_>::read_buffer
                           ((json_source_adaptor<jsoncons::string_source<char>_> *)
                            in_stack_ffffffffffffffc8.size_,
                            (error_code *)in_stack_ffffffffffffffc8.data_);
      bVar1 = std::error_code::operator_cast_to_bool(local_10);
      if (bVar1) {
        return;
      }
      sVar4 = detail::span<const_char,_18446744073709551615UL>::size(&local_20);
      if (sVar4 != 0) {
        in_stack_ffffffffffffffb0 =
             (basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x30);
        pcVar5 = detail::span<const_char,_18446744073709551615UL>::data(&local_20);
        sVar4 = detail::span<const_char,_18446744073709551615UL>::size(&local_20);
        basic_json_parser<char,_std::allocator<char>_>::update
                  (in_stack_ffffffffffffffb0,pcVar5,sVar4);
      }
    }
    bVar1 = basic_json_parser<char,_std::allocator<char>_>::source_exhausted
                      ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x30));
    __fd = (int)*(undefined8 *)(in_RDI + 0x28);
    uVar6 = bVar1;
    basic_json_parser<char,_std::allocator<char>_>::parse_some
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(error_code *)0x4e6070);
    bVar2 = std::error_code::operator_cast_to_bool(local_10);
    if (bVar2) {
      return;
    }
    if (bVar1) {
      bVar1 = basic_json_parser<char,_std::allocator<char>_>::enter
                        ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x30));
      if (bVar1) break;
      uVar3 = basic_json_parser<char,_std::allocator<char>_>::accept
                        ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x30),__fd,
                         __addr,(socklen_t *)CONCAT71(in_register_00000009,uVar6));
      if ((uVar3 & 1) == 0) {
        std::error_code::operator=
                  ((error_code *)in_stack_ffffffffffffffb0,
                   (json_errc)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
        return;
      }
    }
  }
  basic_json_parser<char,_std::allocator<char>_>::skip_whitespace(in_stack_ffffffffffffffb0);
  while( true ) {
    bVar1 = json_source_adaptor<jsoncons::string_source<char>_>::eof
                      ((json_source_adaptor<jsoncons::string_source<char>_> *)0x4e60ed);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    basic_json_parser<char,_std::allocator<char>_>::skip_whitespace(in_stack_ffffffffffffffb0);
    bVar1 = basic_json_parser<char,_std::allocator<char>_>::source_exhausted
                      ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x30));
    if (!bVar1) break;
    in_stack_ffffffffffffffc8 =
         json_source_adaptor<jsoncons::string_source<char>_>::read_buffer
                   ((json_source_adaptor<jsoncons::string_source<char>_> *)
                    in_stack_ffffffffffffffc8.size_,(error_code *)in_stack_ffffffffffffffc8.data_);
    bVar1 = std::error_code::operator_cast_to_bool(local_10);
    if (bVar1) {
      return;
    }
    sVar4 = detail::span<const_char,_18446744073709551615UL>::size
                      ((span<const_char,_18446744073709551615UL> *)&stack0xffffffffffffffc8);
    if (sVar4 != 0) {
      this_00 = (basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x30);
      pcVar5 = detail::span<const_char,_18446744073709551615UL>::data
                         ((span<const_char,_18446744073709551615UL> *)&stack0xffffffffffffffc8);
      sVar4 = detail::span<const_char,_18446744073709551615UL>::size
                        ((span<const_char,_18446744073709551615UL> *)&stack0xffffffffffffffc8);
      basic_json_parser<char,_std::allocator<char>_>::update(this_00,pcVar5,sVar4);
    }
  }
  return;
}

Assistant:

void read_next(std::error_code& ec)
        {
            if (source_.is_error())
            {
                ec = json_errc::source_error;
                return;
            }        
            parser_.reset();
            while (!parser_.stopped())
            {
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                bool eof = parser_.source_exhausted();
                parser_.parse_some(visitor_, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                if (eof)
                {
                    if (parser_.enter())
                    {
                        break;
                    }
                    else if (!parser_.accept())
                    {
                        ec = json_errc::unexpected_eof;
                        return;
                    }
                }
            }
            
            parser_.skip_whitespace();
            while (!source_.eof())
            {
                parser_.skip_whitespace();
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                else
                {
                    break;
                }
            }
        }